

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

bool __thiscall
wasm::OptimizeInstructions::areConsecutiveInputsEqual
          (OptimizeInstructions *this,Expression *left,Expression *right)

{
  bool bVar1;
  PassOptions *passOptions;
  Module *module;
  Expression *pEVar2;
  Expression *right_00;
  undefined1 local_2f0 [8];
  EffectAnalyzer rightEffects;
  EffectAnalyzer originalRightEffects;
  Expression *originalRight;
  Expression *right_local;
  Expression *left_local;
  OptimizeInstructions *this_local;
  
  passOptions = Pass::getPassOptions((Pass *)this);
  module = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
  pEVar2 = Properties::getFallthrough(left,passOptions,module,NoTeeBrIf);
  bVar1 = areMatchingTeeAndGet(this,pEVar2,right);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    pEVar2 = getFallthrough(this,pEVar2);
    right_00 = getFallthrough(this,right);
    bVar1 = ExpressionAnalyzer::equal(pEVar2,right_00);
    if (bVar1) {
      if (right != right_00) {
        effects((EffectAnalyzer *)
                &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
                right);
        effects((EffectAnalyzer *)local_2f0,this,right_00);
        bVar1 = EffectAnalyzer::invalidates
                          ((EffectAnalyzer *)
                           &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,(EffectAnalyzer *)local_2f0);
        if (bVar1) {
          this_local._7_1_ = 0;
        }
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2f0);
        EffectAnalyzer::~EffectAnalyzer
                  ((EffectAnalyzer *)
                   &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (bVar1) goto LAB_01f7c5de;
      }
      bVar1 = Properties::isGenerative(pEVar2);
      this_local._7_1_ = (bVar1 ^ 0xffU) & 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
LAB_01f7c5de:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool areConsecutiveInputsEqual(Expression* left, Expression* right) {
    // When we look for a tee/get pair, we can consider the fallthrough values
    // for the first, as the fallthrough happens last (however, we must use
    // NoTeeBrIf as we do not want to look through the tee). We cannot do this
    // on the second, however, as there could be effects in the middle.
    // TODO: Use effects here perhaps.
    left =
      Properties::getFallthrough(left,
                                 getPassOptions(),
                                 *getModule(),
                                 Properties::FallthroughBehavior::NoTeeBrIf);
    if (areMatchingTeeAndGet(left, right)) {
      return true;
    }

    // Ignore extraneous things and compare them syntactically. We can also
    // look at the full fallthrough for both sides now.
    left = getFallthrough(left);
    auto* originalRight = right;
    right = getFallthrough(right);
    if (!ExpressionAnalyzer::equal(left, right)) {
      return false;
    }

    // We must also not have non-fallthrough effects that invalidate us, such as
    // this situation:
    //
    //  (local.get $x)
    //  (block
    //    (local.set $x ..)
    //    (local.get $x)
    //  )
    //
    // The fallthroughs are identical, but the set may cause us to read a
    // different value.
    if (originalRight != right) {
      // TODO: We could be more precise here and ignore right itself in
      //       originalRightEffects.
      auto originalRightEffects = effects(originalRight);
      auto rightEffects = effects(right);
      if (originalRightEffects.invalidates(rightEffects)) {
        return false;
      }
    }

    // To be equal, they must also be known to return the same result
    // deterministically.
    return !Properties::isGenerative(left);
  }